

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMinkowskiPenetrationDepthSolver.cpp
# Opt level: O2

btVector3 * btMinkowskiPenetrationDepthSolver::getPenetrationDirections(void)

{
  int iVar1;
  
  if ((getPenetrationDirections()::sPenetrationDirections == '\0') &&
     (iVar1 = __cxa_guard_acquire(&getPenetrationDirections()::sPenetrationDirections), iVar1 != 0))
  {
    getPenetrationDirections::sPenetrationDirections[0].m_floats[0] = _DAT_001b19d0;
    getPenetrationDirections::sPenetrationDirections[0].m_floats[1] = _UNK_001b19d4;
    getPenetrationDirections::sPenetrationDirections[0].m_floats[2] = _UNK_001b19d8;
    getPenetrationDirections::sPenetrationDirections[0].m_floats[3] = _UNK_001b19dc;
    getPenetrationDirections::sPenetrationDirections[1].m_floats[0] = _DAT_001b19e0;
    getPenetrationDirections::sPenetrationDirections[1].m_floats[1] = _UNK_001b19e4;
    getPenetrationDirections::sPenetrationDirections[1].m_floats[2] = _UNK_001b19e8;
    getPenetrationDirections::sPenetrationDirections[1].m_floats[3] = _UNK_001b19ec;
    getPenetrationDirections::sPenetrationDirections[2].m_floats[0] = _DAT_001b19f0;
    getPenetrationDirections::sPenetrationDirections[2].m_floats[1] = _UNK_001b19f4;
    getPenetrationDirections::sPenetrationDirections[2].m_floats[2] = _UNK_001b19f8;
    getPenetrationDirections::sPenetrationDirections[2].m_floats[3] = _UNK_001b19fc;
    getPenetrationDirections::sPenetrationDirections[3].m_floats[0] = _DAT_001b1a00;
    getPenetrationDirections::sPenetrationDirections[3].m_floats[1] = _UNK_001b1a04;
    getPenetrationDirections::sPenetrationDirections[3].m_floats[2] = _UNK_001b1a08;
    getPenetrationDirections::sPenetrationDirections[3].m_floats[3] = _UNK_001b1a0c;
    getPenetrationDirections::sPenetrationDirections[4].m_floats[0] = _DAT_001b1a10;
    getPenetrationDirections::sPenetrationDirections[4].m_floats[1] = _UNK_001b1a14;
    getPenetrationDirections::sPenetrationDirections[4].m_floats[2] = _UNK_001b1a18;
    getPenetrationDirections::sPenetrationDirections[4].m_floats[3] = _UNK_001b1a1c;
    getPenetrationDirections::sPenetrationDirections[5].m_floats[0] = _DAT_001b1a20;
    getPenetrationDirections::sPenetrationDirections[5].m_floats[1] = _UNK_001b1a24;
    getPenetrationDirections::sPenetrationDirections[5].m_floats[2] = _UNK_001b1a28;
    getPenetrationDirections::sPenetrationDirections[5].m_floats[3] = _UNK_001b1a2c;
    getPenetrationDirections::sPenetrationDirections[6].m_floats[0] = _DAT_001b1a30;
    getPenetrationDirections::sPenetrationDirections[6].m_floats[1] = _UNK_001b1a34;
    getPenetrationDirections::sPenetrationDirections[6].m_floats[2] = _UNK_001b1a38;
    getPenetrationDirections::sPenetrationDirections[6].m_floats[3] = _UNK_001b1a3c;
    getPenetrationDirections::sPenetrationDirections[7].m_floats[0] = _DAT_001b1a40;
    getPenetrationDirections::sPenetrationDirections[7].m_floats[1] = _UNK_001b1a44;
    getPenetrationDirections::sPenetrationDirections[7].m_floats[2] = _UNK_001b1a48;
    getPenetrationDirections::sPenetrationDirections[7].m_floats[3] = _UNK_001b1a4c;
    getPenetrationDirections::sPenetrationDirections[8].m_floats[0] = _DAT_001b1a50;
    getPenetrationDirections::sPenetrationDirections[8].m_floats[1] = _UNK_001b1a54;
    getPenetrationDirections::sPenetrationDirections[8].m_floats[2] = _UNK_001b1a58;
    getPenetrationDirections::sPenetrationDirections[8].m_floats[3] = _UNK_001b1a5c;
    getPenetrationDirections::sPenetrationDirections[9].m_floats[0] = _DAT_001b1a60;
    getPenetrationDirections::sPenetrationDirections[9].m_floats[1] = _UNK_001b1a64;
    getPenetrationDirections::sPenetrationDirections[9].m_floats[2] = _UNK_001b1a68;
    getPenetrationDirections::sPenetrationDirections[9].m_floats[3] = _UNK_001b1a6c;
    getPenetrationDirections::sPenetrationDirections[10].m_floats[0] = _DAT_001b1a70;
    getPenetrationDirections::sPenetrationDirections[10].m_floats[1] = _UNK_001b1a74;
    getPenetrationDirections::sPenetrationDirections[10].m_floats[2] = _UNK_001b1a78;
    getPenetrationDirections::sPenetrationDirections[10].m_floats[3] = _UNK_001b1a7c;
    getPenetrationDirections::sPenetrationDirections[0xb].m_floats[0] = _DAT_001b1a80;
    getPenetrationDirections::sPenetrationDirections[0xb].m_floats[1] = _UNK_001b1a84;
    getPenetrationDirections::sPenetrationDirections[0xb].m_floats[2] = _UNK_001b1a88;
    getPenetrationDirections::sPenetrationDirections[0xb].m_floats[3] = _UNK_001b1a8c;
    getPenetrationDirections::sPenetrationDirections[0xc].m_floats[0] = _DAT_001b1a90;
    getPenetrationDirections::sPenetrationDirections[0xc].m_floats[1] = _UNK_001b1a94;
    getPenetrationDirections::sPenetrationDirections[0xc].m_floats[2] = _UNK_001b1a98;
    getPenetrationDirections::sPenetrationDirections[0xc].m_floats[3] = _UNK_001b1a9c;
    getPenetrationDirections::sPenetrationDirections[0xd].m_floats[0] = _DAT_001b1aa0;
    getPenetrationDirections::sPenetrationDirections[0xd].m_floats[1] = _UNK_001b1aa4;
    getPenetrationDirections::sPenetrationDirections[0xd].m_floats[2] = _UNK_001b1aa8;
    getPenetrationDirections::sPenetrationDirections[0xd].m_floats[3] = _UNK_001b1aac;
    getPenetrationDirections::sPenetrationDirections[0xe].m_floats[0] = _DAT_001b1ab0;
    getPenetrationDirections::sPenetrationDirections[0xe].m_floats[1] = _UNK_001b1ab4;
    getPenetrationDirections::sPenetrationDirections[0xe].m_floats[2] = _UNK_001b1ab8;
    getPenetrationDirections::sPenetrationDirections[0xe].m_floats[3] = _UNK_001b1abc;
    getPenetrationDirections::sPenetrationDirections[0xf].m_floats[0] = _DAT_001b1ac0;
    getPenetrationDirections::sPenetrationDirections[0xf].m_floats[1] = _UNK_001b1ac4;
    getPenetrationDirections::sPenetrationDirections[0xf].m_floats[2] = _UNK_001b1ac8;
    getPenetrationDirections::sPenetrationDirections[0xf].m_floats[3] = _UNK_001b1acc;
    getPenetrationDirections::sPenetrationDirections[0x10].m_floats[0] = _DAT_001b1ad0;
    getPenetrationDirections::sPenetrationDirections[0x10].m_floats[1] = _UNK_001b1ad4;
    getPenetrationDirections::sPenetrationDirections[0x10].m_floats[2] = _UNK_001b1ad8;
    getPenetrationDirections::sPenetrationDirections[0x10].m_floats[3] = _UNK_001b1adc;
    getPenetrationDirections::sPenetrationDirections[0x11].m_floats[0] = _DAT_001b1ae0;
    getPenetrationDirections::sPenetrationDirections[0x11].m_floats[1] = _UNK_001b1ae4;
    getPenetrationDirections::sPenetrationDirections[0x11].m_floats[2] = _UNK_001b1ae8;
    getPenetrationDirections::sPenetrationDirections[0x11].m_floats[3] = _UNK_001b1aec;
    getPenetrationDirections::sPenetrationDirections[0x12].m_floats[0] = _DAT_001b1af0;
    getPenetrationDirections::sPenetrationDirections[0x12].m_floats[1] = _UNK_001b1af4;
    getPenetrationDirections::sPenetrationDirections[0x12].m_floats[2] = _UNK_001b1af8;
    getPenetrationDirections::sPenetrationDirections[0x12].m_floats[3] = _UNK_001b1afc;
    getPenetrationDirections::sPenetrationDirections[0x13].m_floats[0] = _DAT_001b1b00;
    getPenetrationDirections::sPenetrationDirections[0x13].m_floats[1] = _UNK_001b1b04;
    getPenetrationDirections::sPenetrationDirections[0x13].m_floats[2] = _UNK_001b1b08;
    getPenetrationDirections::sPenetrationDirections[0x13].m_floats[3] = _UNK_001b1b0c;
    getPenetrationDirections::sPenetrationDirections[0x14].m_floats[0] = _DAT_001b1b10;
    getPenetrationDirections::sPenetrationDirections[0x14].m_floats[1] = _UNK_001b1b14;
    getPenetrationDirections::sPenetrationDirections[0x14].m_floats[2] = _UNK_001b1b18;
    getPenetrationDirections::sPenetrationDirections[0x14].m_floats[3] = _UNK_001b1b1c;
    getPenetrationDirections::sPenetrationDirections[0x15].m_floats[0] = _DAT_001b1b20;
    getPenetrationDirections::sPenetrationDirections[0x15].m_floats[1] = _UNK_001b1b24;
    getPenetrationDirections::sPenetrationDirections[0x15].m_floats[2] = _UNK_001b1b28;
    getPenetrationDirections::sPenetrationDirections[0x15].m_floats[3] = _UNK_001b1b2c;
    getPenetrationDirections::sPenetrationDirections[0x16].m_floats =
         (btScalar  [4])ZEXT816(0x3e9e36f43f737889);
    getPenetrationDirections::sPenetrationDirections[0x17].m_floats =
         (btScalar  [4])ZEXT816(0xbe9e36f43f737889);
    getPenetrationDirections::sPenetrationDirections[0x18].m_floats =
         (btScalar  [4])ZEXT816(0xbf4f1bbd3f167925);
    getPenetrationDirections::sPenetrationDirections[0x19].m_floats =
         (btScalar  [4])ZEXT816(0xbf80000000000000);
    getPenetrationDirections::sPenetrationDirections[0x1a].m_floats =
         (btScalar  [4])ZEXT816(0xbf4f1bbdbf167925);
    getPenetrationDirections::sPenetrationDirections[0x1b].m_floats[0] = _DAT_001b1b70;
    getPenetrationDirections::sPenetrationDirections[0x1b].m_floats[1] = _UNK_001b1b74;
    getPenetrationDirections::sPenetrationDirections[0x1b].m_floats[2] = _UNK_001b1b78;
    getPenetrationDirections::sPenetrationDirections[0x1b].m_floats[3] = _UNK_001b1b7c;
    getPenetrationDirections::sPenetrationDirections[0x1c].m_floats[0] = _DAT_001b1b80;
    getPenetrationDirections::sPenetrationDirections[0x1c].m_floats[1] = _UNK_001b1b84;
    getPenetrationDirections::sPenetrationDirections[0x1c].m_floats[2] = _UNK_001b1b88;
    getPenetrationDirections::sPenetrationDirections[0x1c].m_floats[3] = _UNK_001b1b8c;
    getPenetrationDirections::sPenetrationDirections[0x1d].m_floats[0] = _DAT_001b1b90;
    getPenetrationDirections::sPenetrationDirections[0x1d].m_floats[1] = _UNK_001b1b94;
    getPenetrationDirections::sPenetrationDirections[0x1d].m_floats[2] = _UNK_001b1b98;
    getPenetrationDirections::sPenetrationDirections[0x1d].m_floats[3] = _UNK_001b1b9c;
    getPenetrationDirections::sPenetrationDirections[0x1e].m_floats[0] = _DAT_001b1ba0;
    getPenetrationDirections::sPenetrationDirections[0x1e].m_floats[1] = _UNK_001b1ba4;
    getPenetrationDirections::sPenetrationDirections[0x1e].m_floats[2] = _UNK_001b1ba8;
    getPenetrationDirections::sPenetrationDirections[0x1e].m_floats[3] = _UNK_001b1bac;
    getPenetrationDirections::sPenetrationDirections[0x1f].m_floats[0] = _DAT_001b1bb0;
    getPenetrationDirections::sPenetrationDirections[0x1f].m_floats[1] = _UNK_001b1bb4;
    getPenetrationDirections::sPenetrationDirections[0x1f].m_floats[2] = _UNK_001b1bb8;
    getPenetrationDirections::sPenetrationDirections[0x1f].m_floats[3] = _UNK_001b1bbc;
    getPenetrationDirections::sPenetrationDirections[0x20].m_floats[0] = _DAT_001b1bc0;
    getPenetrationDirections::sPenetrationDirections[0x20].m_floats[1] = _UNK_001b1bc4;
    getPenetrationDirections::sPenetrationDirections[0x20].m_floats[2] = _UNK_001b1bc8;
    getPenetrationDirections::sPenetrationDirections[0x20].m_floats[3] = _UNK_001b1bcc;
    getPenetrationDirections::sPenetrationDirections[0x21].m_floats[0] = _DAT_001b1bd0;
    getPenetrationDirections::sPenetrationDirections[0x21].m_floats[1] = _UNK_001b1bd4;
    getPenetrationDirections::sPenetrationDirections[0x21].m_floats[2] = _UNK_001b1bd8;
    getPenetrationDirections::sPenetrationDirections[0x21].m_floats[3] = _UNK_001b1bdc;
    getPenetrationDirections::sPenetrationDirections[0x22].m_floats[0] = _DAT_001b1be0;
    getPenetrationDirections::sPenetrationDirections[0x22].m_floats[1] = _UNK_001b1be4;
    getPenetrationDirections::sPenetrationDirections[0x22].m_floats[2] = _UNK_001b1be8;
    getPenetrationDirections::sPenetrationDirections[0x22].m_floats[3] = _UNK_001b1bec;
    getPenetrationDirections::sPenetrationDirections[0x23].m_floats[0] = _DAT_001b1bf0;
    getPenetrationDirections::sPenetrationDirections[0x23].m_floats[1] = _UNK_001b1bf4;
    getPenetrationDirections::sPenetrationDirections[0x23].m_floats[2] = _UNK_001b1bf8;
    getPenetrationDirections::sPenetrationDirections[0x23].m_floats[3] = _UNK_001b1bfc;
    getPenetrationDirections::sPenetrationDirections[0x24].m_floats[0] = _DAT_001b1c00;
    getPenetrationDirections::sPenetrationDirections[0x24].m_floats[1] = _UNK_001b1c04;
    getPenetrationDirections::sPenetrationDirections[0x24].m_floats[2] = _UNK_001b1c08;
    getPenetrationDirections::sPenetrationDirections[0x24].m_floats[3] = _UNK_001b1c0c;
    getPenetrationDirections::sPenetrationDirections[0x25].m_floats[0] = _DAT_001b1c10;
    getPenetrationDirections::sPenetrationDirections[0x25].m_floats[1] = _UNK_001b1c14;
    getPenetrationDirections::sPenetrationDirections[0x25].m_floats[2] = _UNK_001b1c18;
    getPenetrationDirections::sPenetrationDirections[0x25].m_floats[3] = _UNK_001b1c1c;
    getPenetrationDirections::sPenetrationDirections[0x26].m_floats[0] = _DAT_001b1c20;
    getPenetrationDirections::sPenetrationDirections[0x26].m_floats[1] = _UNK_001b1c24;
    getPenetrationDirections::sPenetrationDirections[0x26].m_floats[2] = _UNK_001b1c28;
    getPenetrationDirections::sPenetrationDirections[0x26].m_floats[3] = _UNK_001b1c2c;
    getPenetrationDirections::sPenetrationDirections[0x27].m_floats[0] = _DAT_001b1c30;
    getPenetrationDirections::sPenetrationDirections[0x27].m_floats[1] = _UNK_001b1c34;
    getPenetrationDirections::sPenetrationDirections[0x27].m_floats[2] = _UNK_001b1c38;
    getPenetrationDirections::sPenetrationDirections[0x27].m_floats[3] = _UNK_001b1c3c;
    getPenetrationDirections::sPenetrationDirections[0x28].m_floats[0] = _DAT_001b1c40;
    getPenetrationDirections::sPenetrationDirections[0x28].m_floats[1] = _UNK_001b1c44;
    getPenetrationDirections::sPenetrationDirections[0x28].m_floats[2] = _UNK_001b1c48;
    getPenetrationDirections::sPenetrationDirections[0x28].m_floats[3] = _UNK_001b1c4c;
    getPenetrationDirections::sPenetrationDirections[0x29].m_floats[0] = _DAT_001b1c50;
    getPenetrationDirections::sPenetrationDirections[0x29].m_floats[1] = _UNK_001b1c54;
    getPenetrationDirections::sPenetrationDirections[0x29].m_floats[2] = _UNK_001b1c58;
    getPenetrationDirections::sPenetrationDirections[0x29].m_floats[3] = _UNK_001b1c5c;
    __cxa_guard_release(&getPenetrationDirections()::sPenetrationDirections);
  }
  return getPenetrationDirections::sPenetrationDirections;
}

Assistant:

btVector3*	btMinkowskiPenetrationDepthSolver::getPenetrationDirections()
{
	static btVector3	sPenetrationDirections[NUM_UNITSPHERE_POINTS+MAX_PREFERRED_PENETRATION_DIRECTIONS*2] = 
	{
	btVector3(btScalar(0.000000) , btScalar(-0.000000),btScalar(-1.000000)),
	btVector3(btScalar(0.723608) , btScalar(-0.525725),btScalar(-0.447219)),
	btVector3(btScalar(-0.276388) , btScalar(-0.850649),btScalar(-0.447219)),
	btVector3(btScalar(-0.894426) , btScalar(-0.000000),btScalar(-0.447216)),
	btVector3(btScalar(-0.276388) , btScalar(0.850649),btScalar(-0.447220)),
	btVector3(btScalar(0.723608) , btScalar(0.525725),btScalar(-0.447219)),
	btVector3(btScalar(0.276388) , btScalar(-0.850649),btScalar(0.447220)),
	btVector3(btScalar(-0.723608) , btScalar(-0.525725),btScalar(0.447219)),
	btVector3(btScalar(-0.723608) , btScalar(0.525725),btScalar(0.447219)),
	btVector3(btScalar(0.276388) , btScalar(0.850649),btScalar(0.447219)),
	btVector3(btScalar(0.894426) , btScalar(0.000000),btScalar(0.447216)),
	btVector3(btScalar(-0.000000) , btScalar(0.000000),btScalar(1.000000)),
	btVector3(btScalar(0.425323) , btScalar(-0.309011),btScalar(-0.850654)),
	btVector3(btScalar(-0.162456) , btScalar(-0.499995),btScalar(-0.850654)),
	btVector3(btScalar(0.262869) , btScalar(-0.809012),btScalar(-0.525738)),
	btVector3(btScalar(0.425323) , btScalar(0.309011),btScalar(-0.850654)),
	btVector3(btScalar(0.850648) , btScalar(-0.000000),btScalar(-0.525736)),
	btVector3(btScalar(-0.525730) , btScalar(-0.000000),btScalar(-0.850652)),
	btVector3(btScalar(-0.688190) , btScalar(-0.499997),btScalar(-0.525736)),
	btVector3(btScalar(-0.162456) , btScalar(0.499995),btScalar(-0.850654)),
	btVector3(btScalar(-0.688190) , btScalar(0.499997),btScalar(-0.525736)),
	btVector3(btScalar(0.262869) , btScalar(0.809012),btScalar(-0.525738)),
	btVector3(btScalar(0.951058) , btScalar(0.309013),btScalar(0.000000)),
	btVector3(btScalar(0.951058) , btScalar(-0.309013),btScalar(0.000000)),
	btVector3(btScalar(0.587786) , btScalar(-0.809017),btScalar(0.000000)),
	btVector3(btScalar(0.000000) , btScalar(-1.000000),btScalar(0.000000)),
	btVector3(btScalar(-0.587786) , btScalar(-0.809017),btScalar(0.000000)),
	btVector3(btScalar(-0.951058) , btScalar(-0.309013),btScalar(-0.000000)),
	btVector3(btScalar(-0.951058) , btScalar(0.309013),btScalar(-0.000000)),
	btVector3(btScalar(-0.587786) , btScalar(0.809017),btScalar(-0.000000)),
	btVector3(btScalar(-0.000000) , btScalar(1.000000),btScalar(-0.000000)),
	btVector3(btScalar(0.587786) , btScalar(0.809017),btScalar(-0.000000)),
	btVector3(btScalar(0.688190) , btScalar(-0.499997),btScalar(0.525736)),
	btVector3(btScalar(-0.262869) , btScalar(-0.809012),btScalar(0.525738)),
	btVector3(btScalar(-0.850648) , btScalar(0.000000),btScalar(0.525736)),
	btVector3(btScalar(-0.262869) , btScalar(0.809012),btScalar(0.525738)),
	btVector3(btScalar(0.688190) , btScalar(0.499997),btScalar(0.525736)),
	btVector3(btScalar(0.525730) , btScalar(0.000000),btScalar(0.850652)),
	btVector3(btScalar(0.162456) , btScalar(-0.499995),btScalar(0.850654)),
	btVector3(btScalar(-0.425323) , btScalar(-0.309011),btScalar(0.850654)),
	btVector3(btScalar(-0.425323) , btScalar(0.309011),btScalar(0.850654)),
	btVector3(btScalar(0.162456) , btScalar(0.499995),btScalar(0.850654))
	};

	return sPenetrationDirections;
}